

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O1

void __thiscall
FZipExploder::InsertCode
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          uint pos,int bits,unsigned_short code,int len,uchar value)

{
  uint uVar1;
  HuffNode *pHVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = (uint)code;
  uVar7 = (ulong)pos;
  do {
    if (len < 1) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                    ,0x60,
                    "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                   );
    }
    bVar4 = (byte)bits;
    uVar3 = (~(-1 << (bVar4 & 0x1f)) & uVar6 & 0xffff) + (int)uVar7;
    iVar5 = len - bits;
    if (iVar5 == 0 || len < bits) {
      if (bits - len != 0x1f) {
        pHVar2 = decoder->Array;
        iVar5 = -(-1 << ((byte)(bits - len) & 0x1f));
        do {
          pHVar2[uVar3].Length = (byte)len;
          pHVar2[uVar3].Value = value;
          if (pHVar2[uVar3].ChildTable != 0) {
            __assert_fail("decoder[node].ChildTable == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                          ,0x7d,
                          "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                         );
          }
          uVar3 = uVar3 + (1 << ((byte)len & 0x1f));
          iVar5 = iVar5 + -1;
        } while (0 < iVar5);
      }
      return;
    }
    pHVar2 = decoder->Array;
    uVar7 = (ulong)pHVar2[uVar3].ChildTable;
    if (pHVar2[uVar3].ChildTable == 0) {
      uVar1 = decoder->Count;
      uVar7 = (ulong)uVar1;
      TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::Grow(decoder,0x10);
      decoder->Count = decoder->Count + 0x10;
      pHVar2 = decoder->Array;
      *(undefined8 *)(pHVar2 + uVar7 + 0xc) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 0xc + 2) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 8) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 8 + 2) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 4) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 4 + 2) = 0;
      *(undefined8 *)(pHVar2 + uVar7) = 0;
      *(undefined8 *)(pHVar2 + uVar7 + 2) = 0;
      pHVar2 = decoder->Array;
      pHVar2[uVar3].ChildTable = (unsigned_short)uVar1;
      pHVar2[uVar3].Length = bVar4;
      pHVar2[uVar3].Value = '\0';
    }
    else {
      if ((uint)pHVar2[uVar3].Length != bits) {
        __assert_fail("decoder[node].Length == bits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                      ,0x70,
                      "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                     );
      }
      if (pHVar2[uVar3].Value != '\0') {
        __assert_fail("decoder[node].Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                      ,0x71,
                      "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                     );
      }
    }
    uVar6 = (uVar6 & 0xffff) >> (bVar4 & 0x1f);
    bits = 4;
    len = iVar5;
  } while( true );
}

Assistant:

void FZipExploder::InsertCode(TArray<HuffNode> &decoder, unsigned int pos, int bits, unsigned short code, int len, unsigned char value)
{
	assert(len > 0);
	unsigned int node = pos + (code & ((1 << bits) - 1));

	if (len > bits)
	{ // This code uses more bits than this level has room for. Store the bottom bits
	  // in this table, then proceed to the next one.
		unsigned int child = decoder[node].ChildTable;
		if (child == 0)
		{ // Need to create child table.
			child = InitTable(decoder, 1 << REST_BIT_LEN);
			decoder[node].ChildTable = child;
			decoder[node].Length = bits;
			decoder[node].Value = 0;
		}
		else
		{
			assert(decoder[node].Length == bits);
			assert(decoder[node].Value == 0);
		}
		InsertCode(decoder, child, REST_BIT_LEN, code >> bits, len - bits, value);
	}
	else
	{ // If this code uses fewer bits than this level of the table, it is
	  // inserted repeatedly for each value that matches it at its lower
	  // bits.
		for (int i = 1 << (bits - len); --i >= 0; node += 1 << len)
		{
			decoder[node].Length = len;
			decoder[node].Value = value;
			assert(decoder[node].ChildTable == 0);
		}
	}
}